

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_test.cc
# Opt level: O0

void __thiscall BufTest_Append_Test::TestBody(BufTest_Append_Test *this)

{
  ulong uVar1;
  bool bVar2;
  BUF_MEM *__p;
  char *pcVar3;
  pointer pbVar4;
  void *in;
  size_t len;
  char *in_R9;
  AssertHelper local_268;
  Message local_260;
  allocator local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1e0;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_1b0 [8];
  string str;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BUF_MEM> buf;
  BufTest_Append_Test *this_local;
  
  __p = BUF_MEM_new();
  std::unique_ptr<buf_mem_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<buf_mem_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)__p);
  testing::AssertionResult::AssertionResult<std::unique_ptr<buf_mem_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x86b773,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = BUF_MEM_append(pbVar4,(void *)0x0,0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar2) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_80,
                 (AssertionResult *)"BUF_MEM_append(buf.get(), nullptr, 0)","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                 ,0x59,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_cc = BUF_MEM_append(pbVar4,"hello ",6);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_c8,&local_cc,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar2) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_c8,
                   (AssertionResult *)"BUF_MEM_append(buf.get(), \"hello \", 6)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                   ,0x5a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        local_114 = BUF_MEM_append(pbVar4,(void *)0x0,0);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar2) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)"BUF_MEM_append(buf.get(), nullptr, 0)","false","true",in_R9
                    );
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                     ,0x5b,pcVar3);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                             );
          local_15c = BUF_MEM_append(pbVar4,"world",5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_158,&local_15c,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar2) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)((long)&str.field_2 + 8),(internal *)local_158,
                       (AssertionResult *)"BUF_MEM_append(buf.get(), \"world\", 5)","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                       ,0x5c,pcVar3);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
            testing::Message::~Message(&local_168);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,0x80,'A',
                       (allocator<char> *)
                       ((long)&gtest_ar__5.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7));
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&gtest_ar__5.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7));
            pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            in = (void *)std::__cxx11::string::data();
            len = std::__cxx11::string::size();
            local_1cc = BUF_MEM_append(pbVar4,in,len);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1c8,&local_1cc,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
            if (!bVar2) {
              testing::Message::Message(&local_1d8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar.message_,(internal *)local_1c8,
                         (AssertionResult *)"BUF_MEM_append(buf.get(), str.data(), str.size())",
                         "false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                         ,0x5e,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
              testing::internal::AssertHelper::~AssertHelper(&local_1e0);
              std::__cxx11::string::~string((string *)&gtest_ar.message_);
              testing::Message::~Message(&local_1d8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              std::operator+(&local_230,"hello world",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b0);
              pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              pcVar3 = pbVar4->data;
              pbVar4 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              uVar1 = pbVar4->length;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_250,pcVar3,uVar1,&local_251);
              testing::internal::EqHelper::
              Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                        ((EqHelper *)local_210,"\"hello world\" + str",
                         "std::string(buf->data, buf->length)",&local_230,&local_250);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator((allocator<char> *)&local_251);
              std::__cxx11::string::~string((string *)&local_230);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
              if (!bVar2) {
                testing::Message::Message(&local_260);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                testing::internal::AssertHelper::AssertHelper
                          (&local_268,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf_test.cc"
                           ,0x60,pcVar3);
                testing::internal::AssertHelper::operator=(&local_268,&local_260);
                testing::internal::AssertHelper::~AssertHelper(&local_268);
                testing::Message::~Message(&local_260);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = 0;
            }
            std::__cxx11::string::~string((string *)local_1b0);
          }
        }
      }
    }
  }
  std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(BufTest, Append) {
  bssl::UniquePtr<BUF_MEM> buf(BUF_MEM_new());
  ASSERT_TRUE(buf);

  ASSERT_TRUE(BUF_MEM_append(buf.get(), nullptr, 0));
  ASSERT_TRUE(BUF_MEM_append(buf.get(), "hello ", 6));
  ASSERT_TRUE(BUF_MEM_append(buf.get(), nullptr, 0));
  ASSERT_TRUE(BUF_MEM_append(buf.get(), "world", 5));
  std::string str(128, 'A');
  ASSERT_TRUE(BUF_MEM_append(buf.get(), str.data(), str.size()));

  EXPECT_EQ("hello world" + str, std::string(buf->data, buf->length));
}